

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sclUpsize.c
# Opt level: O2

void Abc_SclUpsizePerformInt(SC_Lib *pLib,Abc_Ntk_t *pNtk,SC_SizePars *pPars)

{
  Vec_Wec_t *__ptr;
  Vec_Que_t *pVVar1;
  float *pfVar2;
  int iVar3;
  uint fVerbose;
  abctime aVar4;
  SC_Man *p;
  Vec_Int_t *pVVar5;
  int *piVar6;
  Vec_Int_t *pVVar7;
  abctime aVar8;
  Vec_Int_t *vCone;
  long lVar9;
  FILE *__stream;
  char *pcVar10;
  void *pvVar11;
  Abc_Obj_t *pAVar12;
  ulong uVar13;
  SC_Man *pSVar14;
  Abc_Ntk_t *pAVar15;
  ulong uVar16;
  ulong uVar17;
  int iVar18;
  uint uVar19;
  long lVar20;
  size_t __size;
  float fVar21;
  float fVar22;
  double dVar23;
  double dVar24;
  int in_stack_ffffffffffffff68;
  int local_78;
  int local_74;
  int local_70;
  int local_6c;
  int local_68;
  int local_64;
  
  iVar3 = pPars->TimeOut;
  if ((long)iVar3 == 0) {
    lVar20 = 0;
  }
  else {
    aVar4 = Abc_Clock();
    lVar20 = aVar4 + (long)iVar3 * 1000000;
  }
  if (pPars->fVerbose != 0) {
    printf("Parameters: ");
    printf("Iters =%5d.  ",(ulong)(uint)pPars->nIters);
    printf("Time win =%3d %%. ",(ulong)(uint)pPars->Window);
    printf("Update ratio =%3d %%. ",(ulong)(uint)pPars->Ratio);
    printf("UseDept =%2d. ",(ulong)(uint)pPars->fUseDept);
    printf("UseWL =%2d. ",(ulong)(uint)pPars->fUseWireLoads);
    printf("Target =%5d ps. ",(ulong)(uint)pPars->DelayUser);
    printf("DelayGap =%3d ps. ",(ulong)(uint)pPars->DelayGap);
    printf("Timeout =%4d sec",(ulong)(uint)pPars->TimeOut);
    putchar(10);
  }
  if (pPars->Window == 1) {
    pPars->Window = (40000 < pNtk->nObjCounts[7]) + 1;
  }
  uVar17 = (ulong)(uint)pPars->BuffTreeEst;
  p = Abc_SclManStart(pLib,pNtk,pPars->fUseWireLoads,pPars->fUseDept,0.0,pPars->BuffTreeEst);
  aVar4 = Abc_Clock();
  p->timeTotal = aVar4;
  if (p->vGatesBest != (Vec_Int_t *)0x0) {
    __assert_fail("p->vGatesBest == NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/map/scl/sclUpsize.c"
                  ,0x37f,"void Abc_SclUpsizePerformInt(SC_Lib *, Abc_Ntk_t *, SC_SizePars *)");
  }
  pVVar7 = p->pNtk->vGates;
  pVVar5 = (Vec_Int_t *)malloc(0x10);
  iVar3 = pVVar7->nSize;
  pVVar5->nSize = iVar3;
  pVVar5->nCap = iVar3;
  if ((long)iVar3 == 0) {
    __size = 0;
    piVar6 = (int *)0x0;
  }
  else {
    __size = (long)iVar3 << 2;
    piVar6 = (int *)malloc(__size);
  }
  pVVar5->pArray = piVar6;
  memcpy(piVar6,pVVar7->pArray,__size);
  p->vGatesBest = pVVar5;
  fVar21 = p->MaxDelay0;
  p->BestDelay = fVar21;
  if (fVar21 <= (float)pPars->DelayUser) {
    printf("Current delay (%.2f ps) does not exceed the target delay (%.2f ps). Upsizing is not performed.\n"
           ,(double)fVar21,(double)pPars->DelayUser);
    uVar19 = 0;
    local_78 = 0;
    local_74 = 0;
    local_68 = 0;
    local_6c = 0;
  }
  else {
    iVar3 = -1;
    local_70 = 0;
    local_64 = 0;
    local_78 = 0;
    local_74 = 0;
    local_68 = 0;
    local_6c = 0;
    pVVar5 = (Vec_Int_t *)0x0;
    pVVar7 = (Vec_Int_t *)0x0;
    for (uVar19 = 0; (int)uVar19 < pPars->nIters; uVar19 = uVar19 + 1) {
      for (iVar18 = (uint)(uVar19 % 7 == 6) + pPars->Window; iVar18 < 0x65; iVar18 = iVar18 * 2) {
        aVar4 = Abc_Clock();
        pVVar7 = Abc_SclFindCriticalCoWindow(p,iVar18);
        pVVar5 = Abc_SclFindCriticalNodeWindow(p,pVVar7,iVar18,pPars->fUseDept);
        aVar8 = Abc_Clock();
        p->timeCone = p->timeCone + (aVar8 - aVar4);
        aVar4 = Abc_Clock();
        if ((pPars->BypassFreq == 0 || uVar19 == 0) || ((int)uVar19 % pPars->BypassFreq != 0)) {
          uVar17 = (ulong)uVar19;
          iVar3 = Abc_SclFindUpsizes(p,pVVar5,pPars->Ratio,pPars->Notches,uVar19,pPars->DelayGap,
                                     in_stack_ffffffffffffff68);
        }
        else {
          in_stack_ffffffffffffff68 = pPars->fVeryVerbose;
          iVar3 = Abc_SclFindBypasses(p,pVVar5,0,pPars->Notches,(int)uVar17,pPars->DelayGap,
                                      in_stack_ffffffffffffff68);
        }
        aVar8 = Abc_Clock();
        p->timeSize = p->timeSize + (aVar8 - aVar4);
        aVar4 = Abc_Clock();
        Abc_SclUnmarkCriticalNodeWindow(p,pVVar5);
        Abc_SclUnmarkCriticalNodeWindow(p,pVVar7);
        aVar8 = Abc_Clock();
        p->timeCone = p->timeCone + (aVar8 - aVar4);
        if (0 < iVar3) goto LAB_003a188a;
        Vec_IntFree(pVVar7);
        Vec_IntFree(pVVar5);
      }
      if (iVar3 == 0) break;
LAB_003a188a:
      aVar4 = Abc_Clock();
      if (pPars->fUseDept == 0) {
        vCone = Abc_SclFindTFO(p->pNtk,pVVar5);
        Abc_SclTimeCone(p,vCone);
        local_64 = vCone->nSize;
        Vec_IntFree(vCone);
      }
      else if ((p->vChanged->nSize == 0) ||
              ((pPars->BypassFreq != 0 && uVar19 != 0 && ((int)uVar19 % pPars->BypassFreq == 0)))) {
        Abc_SclTimeNtkRecompute(p,(float *)0x0,(float *)0x0,pPars->fUseDept,0.0);
      }
      else {
        local_64 = Abc_SclTimeIncUpdate(p);
      }
      aVar8 = Abc_Clock();
      p->timeTime = p->timeTime + (aVar8 - aVar4);
      fVar21 = Abc_SclReadMaxDelay(p);
      p->MaxDelay = fVar21;
      if (p->BestDelay <= fVar21) {
        local_70 = local_70 + 1;
      }
      else {
        p->BestDelay = fVar21;
        Abc_SclApplyUpdateToBest(p->vGatesBest,p->pNtk->vGates,p->vUpdates);
        p->vUpdates2->nSize = 0;
        local_70 = 0;
      }
      uVar17 = (ulong)(uint)pVVar5->nSize;
      fVerbose = 1;
      if (pPars->fVeryVerbose == 0) {
        fVerbose = (uint)(local_70 == 0 && pPars->fVerbose != 0);
      }
      in_stack_ffffffffffffff68 = local_64;
      Abc_SclUpsizePrint(p,uVar19,iVar18,pVVar7->nSize,pVVar5->nSize,iVar3,local_64,fVerbose);
      local_78 = local_78 + pVVar7->nSize;
      local_74 = local_74 + pVVar5->nSize;
      local_68 = local_68 + local_64;
      local_6c = local_6c + iVar3;
      Vec_IntFree(pVVar7);
      Vec_IntFree(pVVar5);
      if ((((lVar20 != 0) && (aVar4 = Abc_Clock(), lVar20 < aVar4)) ||
          (pPars->nIterNoChange < local_70)) || (p->BestDelay <= (float)pPars->DelayUser)) break;
    }
  }
  pAVar15 = p->pNtk;
  pVVar7 = p->vGatesBest;
  p->vGatesBest = pAVar15->vGates;
  pAVar15->vGates = pVVar7;
  if ((pPars->BypassFreq != 0) &&
     (Abc_SclUndoRecentChanges(pAVar15,p->vUpdates2), pPars->BypassFreq != 0)) {
    Abc_SclUpsizeRemoveDangling(p,pNtk);
  }
  Abc_SclTimeNtkRecompute(p,&p->SumArea,&p->MaxDelay,0,0.0);
  if (pPars->fVerbose == 0) {
    iVar3 = 0x7b9aaf;
    printf(
          "                                                                                                                                                  \r"
          );
  }
  else {
    iVar3 = uVar19 + (uVar19 == 0);
    pSVar14 = p;
    Abc_SclUpsizePrint(p,uVar19,pPars->Window,local_78 / iVar3,local_74 / iVar3,local_6c / iVar3,
                       local_68 / iVar3,1);
    iVar3 = (int)pSVar14;
  }
  aVar4 = Abc_Clock();
  lVar9 = aVar4 - p->timeTotal;
  p->timeTotal = lVar9;
  if (pPars->fVerbose != 0) {
    p->timeOther = lVar9 - (p->timeCone + p->timeSize + p->timeTime);
    Abc_Print(iVar3,"%s =","Runtime: Critical path");
    dVar23 = 0.0;
    if (p->timeTotal != 0) {
      dVar23 = ((double)p->timeCone * 100.0) / (double)p->timeTotal;
    }
    Abc_Print(iVar3,"%9.2f sec (%6.2f %%)\n",(double)p->timeCone / 1000000.0,dVar23);
    Abc_Print(iVar3,"%s =","Runtime: Sizing eval  ");
    dVar23 = 0.0;
    if (p->timeTotal != 0) {
      dVar23 = ((double)p->timeSize * 100.0) / (double)p->timeTotal;
    }
    Abc_Print(iVar3,"%9.2f sec (%6.2f %%)\n",(double)p->timeSize / 1000000.0,dVar23);
    Abc_Print(iVar3,"%s =","Runtime: Timing update");
    dVar23 = 0.0;
    if (p->timeTotal != 0) {
      dVar23 = ((double)p->timeTime * 100.0) / (double)p->timeTotal;
    }
    Abc_Print(iVar3,"%9.2f sec (%6.2f %%)\n",(double)p->timeTime / 1000000.0,dVar23);
    Abc_Print(iVar3,"%s =","Runtime: Other        ");
    dVar23 = 0.0;
    if (p->timeTotal != 0) {
      dVar23 = ((double)p->timeOther * 100.0) / (double)p->timeTotal;
    }
    Abc_Print(iVar3,"%9.2f sec (%6.2f %%)\n",(double)p->timeOther / 1000000.0,dVar23);
    Abc_Print(iVar3,"%s =","Runtime: TOTAL        ");
    dVar23 = (double)p->timeTotal;
    dVar24 = 0.0;
    if (p->timeTotal != 0) {
      dVar24 = (dVar23 * 100.0) / dVar23;
    }
    Abc_Print(iVar3,"%9.2f sec (%6.2f %%)\n",dVar23 / 1000000.0,dVar24);
  }
  if (pPars->fDumpStats != 0) {
    __stream = fopen("stats2.txt","a+");
    pcVar10 = p->pNtk->pName;
    iVar3 = strcmp(Abc_SclDumpStats_FileNameOld,pcVar10);
    if (iVar3 == 0) {
      fputc(0x20,__stream);
      fprintf(__stream,"%.1f ",
              ((double)p->pNtk->nObjCounts[7] * 100.0) / (double)Abc_SclDumpStats_nNodesOld);
      fprintf(__stream,"%.1f ",((double)(int)p->SumArea * 100.0) / (double)Abc_SclDumpStats_nAreaOld
             );
      fprintf(__stream,"%.1f ",
              ((double)(int)p->ReportDelay * 100.0) / (double)Abc_SclDumpStats_nDelayOld);
      aVar4 = Abc_Clock();
      fprintf(__stream,"%.2f",(double)(aVar4 - Abc_SclDumpStats_clk) / 1000000.0);
    }
    else {
      strcpy(Abc_SclDumpStats_FileNameOld,pcVar10);
      fputc(10,__stream);
      pcVar10 = Extra_FileNameWithoutPath(p->pNtk->pName);
      fprintf(__stream,"%s ",pcVar10);
      fprintf(__stream,"%d ",(ulong)(uint)p->pNtk->vPis->nSize);
      fprintf(__stream,"%d ",(ulong)(uint)p->pNtk->vPos->nSize);
      Abc_SclDumpStats_nNodesOld = p->pNtk->nObjCounts[7];
      fprintf(__stream,"%d ");
      Abc_SclDumpStats_nAreaOld = (int)p->SumArea;
      fprintf(__stream,"%d ");
      Abc_SclDumpStats_nDelayOld = (int)p->ReportDelay;
      fprintf(__stream,"%d ");
      Abc_SclDumpStats_clk = Abc_Clock();
    }
    fclose(__stream);
  }
  if ((lVar20 != 0) && (aVar4 = Abc_Clock(), lVar20 < aVar4)) {
    printf("Gate sizing timed out at %d seconds.\n",(ulong)(uint)pPars->TimeOut);
  }
  Abc_SclSclGates2MioGates(pLib,pNtk);
  iVar3 = 0;
  while( true ) {
    pAVar15 = p->pNtk;
    if (pAVar15->vCis->nSize <= iVar3) break;
    pvVar11 = Vec_PtrEntry(pAVar15->vCis,iVar3);
    *(undefined4 *)((long)pvVar11 + 0x38) = 0;
    iVar3 = iVar3 + 1;
  }
  for (iVar3 = 0; iVar3 < pAVar15->vCos->nSize; iVar3 = iVar3 + 1) {
    pAVar12 = Abc_NtkCo(pAVar15,iVar3);
    (pAVar12->field_5).iData = 0;
    pAVar15 = p->pNtk;
  }
  pAVar15->pSCLib = (void *)0x0;
  Vec_IntFreeP(&pAVar15->vGates);
  Vec_IntFreeP(&p->vNodeIter);
  Vec_QueFreeP(&p->vNodeByGain);
  Vec_FltFreeP(&p->vNode2Gain);
  Vec_IntFreeP(&p->vNode2Gate);
  Vec_FltFreeP(&p->vLoads2);
  Vec_FltFreeP(&p->vLoads3);
  Vec_FltFreeP(&p->vTimes2);
  Vec_FltFreeP(&p->vTimes3);
  Vec_IntFreeP(&p->vUpdates);
  Vec_IntFreeP(&p->vUpdates2);
  Vec_IntFreeP(&p->vGatesBest);
  __ptr = p->vLevels;
  if (__ptr != (Vec_Wec_t *)0x0) {
    pVVar7 = __ptr->pArray;
    lVar20 = 8;
    for (lVar9 = 0; lVar9 < __ptr->nCap; lVar9 = lVar9 + 1) {
      pvVar11 = *(void **)((long)&pVVar7->nCap + lVar20);
      if (pvVar11 != (void *)0x0) {
        free(pvVar11);
        pVVar7 = __ptr->pArray;
        *(undefined8 *)((long)&pVVar7->nCap + lVar20) = 0;
      }
      lVar20 = lVar20 + 0x10;
    }
    free(pVVar7);
    free(__ptr);
    p->vLevels = (Vec_Wec_t *)0x0;
  }
  Vec_IntFreeP(&p->vChanged);
  pVVar1 = p->vQue;
  uVar19 = pVVar1->nSize;
  if ((int)uVar19 < 1) {
    __assert_fail("p->nSize > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/vec/vecQue.h"
                  ,0x124,"void Vec_QueCheck(Vec_Que_t *)");
  }
  iVar3 = pVVar1->nCap;
  if (iVar3 < (int)uVar19) {
    __assert_fail("p->nSize <= p->nCap",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/vec/vecQue.h"
                  ,0x125,"void Vec_QueCheck(Vec_Que_t *)");
  }
  uVar16 = (ulong)(uVar19 - 1);
  uVar17 = 0;
  while (uVar13 = uVar16, uVar16 != uVar17) {
    piVar6 = pVVar1->pOrder + uVar17;
    uVar17 = uVar17 + 1;
    if (*piVar6 < 1) {
      __assert_fail("p->pOrder[i] > 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/vec/vecQue.h"
                    ,0x128,"void Vec_QueCheck(Vec_Que_t *)");
    }
  }
  while ((int)uVar13 < iVar3) {
    piVar6 = pVVar1->pOrder + uVar13;
    uVar13 = uVar13 + 1;
    if (*piVar6 != -1) {
      __assert_fail("p->pOrder[i] == -1",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/vec/vecQue.h"
                    ,0x12a,"void Vec_QueCheck(Vec_Que_t *)");
    }
  }
  piVar6 = pVVar1->pHeap;
  if (*piVar6 == -1) {
    uVar17 = 0xffffffffffffffff;
    while (uVar17 - uVar16 != -1) {
      lVar20 = uVar17 + 1;
      uVar17 = uVar17 + 1;
      if (uVar17 != (uint)piVar6[pVVar1->pOrder[lVar20]]) {
        __assert_fail("p->pHeap[p->pOrder[i]] == i",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/vec/vecQue.h"
                      ,0x12e,"void Vec_QueCheck(Vec_Que_t *)");
      }
    }
    lVar20 = 0;
    while ((int)(uVar19 + (int)lVar20) < iVar3) {
      lVar9 = lVar20 + 1;
      lVar20 = lVar20 + 1;
      if (piVar6[uVar16 + lVar9] != -1) {
        __assert_fail("p->pHeap[i] == -1",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/vec/vecQue.h"
                      ,0x130,"void Vec_QueCheck(Vec_Que_t *)");
      }
    }
    lVar20 = 2;
    iVar3 = 3;
    lVar9 = 0x200000000;
    do {
      if ((ulong)uVar19 * 2 == lVar20) {
        Vec_QueFreeP(&p->vQue);
        Vec_FltFreeP(&p->vTimesOut);
        Vec_IntFreeP(&p->vBestFans);
        Vec_FltFreeP(&p->vInDrive);
        Vec_FltFreeP(&p->vWireCaps);
        if (p->pLoads != (SC_Pair *)0x0) {
          free(p->pLoads);
          p->pLoads = (SC_Pair *)0x0;
        }
        if (p->pDepts != (SC_Pair *)0x0) {
          free(p->pDepts);
          p->pDepts = (SC_Pair *)0x0;
        }
        if (p->pTimes != (SC_Pair *)0x0) {
          free(p->pTimes);
          p->pTimes = (SC_Pair *)0x0;
        }
        free(p->pSlews);
        free(p);
        return;
      }
      if ((int)lVar20 < (int)uVar19) {
        iVar18 = *(int *)((long)piVar6 + lVar20 * 2);
        pfVar2 = *pVVar1->pCostsFlt;
        if (pfVar2 == (float *)0x0) {
          fVar21 = (float)iVar18;
          fVar22 = (float)*(int *)((long)piVar6 + (lVar9 >> 0x1e));
        }
        else {
          fVar21 = pfVar2[iVar18];
          fVar22 = pfVar2[*(int *)((long)piVar6 + (lVar9 >> 0x1e))];
        }
        if (fVar21 < fVar22) {
          __assert_fail("Vec_QuePrio(p, p->pHeap[i]) >= Vec_QuePrio(p, p->pHeap[child])",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/vec/vecQue.h"
                        ,0x136,"void Vec_QueCheck(Vec_Que_t *)");
        }
      }
      if (iVar3 < (int)uVar19) {
        iVar18 = *(int *)((long)piVar6 + lVar20 * 2);
        pfVar2 = *pVVar1->pCostsFlt;
        if (pfVar2 == (float *)0x0) {
          fVar21 = (float)iVar18;
          fVar22 = (float)piVar6[iVar3];
        }
        else {
          fVar21 = pfVar2[iVar18];
          fVar22 = pfVar2[piVar6[iVar3]];
        }
        if (fVar21 < fVar22) {
          __assert_fail("Vec_QuePrio(p, p->pHeap[i]) >= Vec_QuePrio(p, p->pHeap[child])",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/vec/vecQue.h"
                        ,0x139,"void Vec_QueCheck(Vec_Que_t *)");
        }
      }
      lVar9 = lVar9 + 0x200000000;
      lVar20 = lVar20 + 2;
      iVar3 = iVar3 + 2;
    } while( true );
  }
  __assert_fail("p->pHeap[0] == -1",
                "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/vec/vecQue.h"
                ,300,"void Vec_QueCheck(Vec_Que_t *)");
}

Assistant:

void Abc_SclUpsizePerformInt( SC_Lib * pLib, Abc_Ntk_t * pNtk, SC_SizePars * pPars )
{
    SC_Man * p;
    Vec_Int_t * vPathPos = NULL;    // critical POs
    Vec_Int_t * vPathNodes = NULL;  // critical nodes and PIs
    abctime clk, nRuntimeLimit = pPars->TimeOut ? pPars->TimeOut * CLOCKS_PER_SEC + Abc_Clock() : 0;
    int i = 0, win, nUpsizes = -1, nFramesNoChange = 0, nConeSize = 0;
    int nAllPos, nAllNodes, nAllTfos, nAllUpsizes;
    if ( pPars->fVerbose )
    {
        printf( "Parameters: " );
        printf( "Iters =%5d.  ",          pPars->nIters   );
        printf( "Time win =%3d %%. ",     pPars->Window   );
        printf( "Update ratio =%3d %%. ", pPars->Ratio    );
        printf( "UseDept =%2d. ",         pPars->fUseDept );
        printf( "UseWL =%2d. ",           pPars->fUseWireLoads );
        printf( "Target =%5d ps. ",       pPars->DelayUser );
        printf( "DelayGap =%3d ps. ",     pPars->DelayGap );
        printf( "Timeout =%4d sec",       pPars->TimeOut  );
        printf( "\n" );
    }
    // increase window for larger networks
    if ( pPars->Window == 1 )
        pPars->Window += (Abc_NtkNodeNum(pNtk) > 40000);
    // prepare the manager; collect init stats
    p = Abc_SclManStart( pLib, pNtk, pPars->fUseWireLoads, pPars->fUseDept, 0, pPars->BuffTreeEst );
    p->timeTotal  = Abc_Clock();
    assert( p->vGatesBest == NULL );
    p->vGatesBest = Vec_IntDup( p->pNtk->vGates );
    p->BestDelay  = p->MaxDelay0;
    // perform upsizing
    nAllPos = nAllNodes = nAllTfos = nAllUpsizes = 0;
    if ( p->BestDelay <= pPars->DelayUser )
        printf( "Current delay (%.2f ps) does not exceed the target delay (%.2f ps). Upsizing is not performed.\n", p->BestDelay, (float)pPars->DelayUser );
    else
    for ( i = 0; i < pPars->nIters; i++ )
    {
        for ( win = pPars->Window + ((i % 7) == 6); win <= 100;  win *= 2 )
        {
            // detect critical path
            clk = Abc_Clock();
            vPathPos   = Abc_SclFindCriticalCoWindow( p, win );
            vPathNodes = Abc_SclFindCriticalNodeWindow( p, vPathPos, win, pPars->fUseDept );
            p->timeCone += Abc_Clock() - clk;

            // selectively upsize the nodes
            clk = Abc_Clock();
            if ( pPars->BypassFreq && i && (i % pPars->BypassFreq) == 0 )
                nUpsizes = Abc_SclFindBypasses( p, vPathNodes, pPars->Ratio, pPars->Notches, i, pPars->DelayGap, pPars->fVeryVerbose );
            else
                nUpsizes = Abc_SclFindUpsizes( p, vPathNodes, pPars->Ratio, pPars->Notches, i, pPars->DelayGap, (pPars->BypassFreq > 0) );
            p->timeSize += Abc_Clock() - clk;

            // unmark critical path
            clk = Abc_Clock();
            Abc_SclUnmarkCriticalNodeWindow( p, vPathNodes );
            Abc_SclUnmarkCriticalNodeWindow( p, vPathPos );
            p->timeCone += Abc_Clock() - clk;
            if ( nUpsizes > 0 )
                break;
            Vec_IntFree( vPathPos );
            Vec_IntFree( vPathNodes );
        }
        if ( nUpsizes == 0 )
            break;

        // update timing information
        clk = Abc_Clock();
        if ( pPars->fUseDept )
        {
            if ( Vec_IntSize(p->vChanged) && !(pPars->BypassFreq && i && (i % pPars->BypassFreq) == 0) )
                nConeSize = Abc_SclTimeIncUpdate( p );
            else
                Abc_SclTimeNtkRecompute( p, NULL, NULL, pPars->fUseDept, 0 );
        }
        else
        {
            Vec_Int_t * vTFO = Abc_SclFindTFO( p->pNtk, vPathNodes );
            Abc_SclTimeCone( p, vTFO );
            nConeSize = Vec_IntSize( vTFO );
            Vec_IntFree( vTFO );
        }
        p->timeTime += Abc_Clock() - clk;
//        Abc_SclUpsizePrintDiffs( p, pLib, pNtk );

        // save the best network
        p->MaxDelay = Abc_SclReadMaxDelay( p );
        if ( p->BestDelay > p->MaxDelay )
        {
            p->BestDelay = p->MaxDelay;
            Abc_SclApplyUpdateToBest( p->vGatesBest, p->pNtk->vGates, p->vUpdates );
            Vec_IntClear( p->vUpdates2 );
            nFramesNoChange = 0;
        }
        else
            nFramesNoChange++;

        // report and cleanup
        Abc_SclUpsizePrint( p, i, win, Vec_IntSize(vPathPos), Vec_IntSize(vPathNodes), nUpsizes, nConeSize, pPars->fVeryVerbose || (pPars->fVerbose && nFramesNoChange == 0) ); //|| (i == nIters-1) );
        nAllPos     += Vec_IntSize(vPathPos);
        nAllNodes   += Vec_IntSize(vPathNodes);
        nAllTfos    += nConeSize;
        nAllUpsizes += nUpsizes;
        Vec_IntFree( vPathPos );
        Vec_IntFree( vPathNodes );
        // check timeout
        if ( nRuntimeLimit && Abc_Clock() > nRuntimeLimit )
            break;
        // check no change
        if ( nFramesNoChange > pPars->nIterNoChange )
            break;
        // check best delay
        if ( p->BestDelay <= pPars->DelayUser )
            break;
    }
    // update for best gates and recompute timing
    ABC_SWAP( Vec_Int_t *, p->vGatesBest, p->pNtk->vGates );
    if ( pPars->BypassFreq != 0 )
        Abc_SclUndoRecentChanges( p->pNtk, p->vUpdates2 );
    if ( pPars->BypassFreq != 0 )
        Abc_SclUpsizeRemoveDangling( p, pNtk );
    Abc_SclTimeNtkRecompute( p, &p->SumArea, &p->MaxDelay, 0, 0 );
    if ( pPars->fVerbose )
        Abc_SclUpsizePrint( p, i, pPars->Window, nAllPos/(i?i:1), nAllNodes/(i?i:1), nAllUpsizes/(i?i:1), nAllTfos/(i?i:1), 1 );
    else
        printf( "                                                                                                                                                  \r" );
    // report runtime
    p->timeTotal = Abc_Clock() - p->timeTotal;
    if ( pPars->fVerbose )
    {
        p->timeOther = p->timeTotal - p->timeCone - p->timeSize - p->timeTime;
        ABC_PRTP( "Runtime: Critical path", p->timeCone,  p->timeTotal );
        ABC_PRTP( "Runtime: Sizing eval  ", p->timeSize,  p->timeTotal );
        ABC_PRTP( "Runtime: Timing update", p->timeTime,  p->timeTotal );
        ABC_PRTP( "Runtime: Other        ", p->timeOther, p->timeTotal );
        ABC_PRTP( "Runtime: TOTAL        ", p->timeTotal, p->timeTotal );
    }
    if ( pPars->fDumpStats )
        Abc_SclDumpStats( p, "stats2.txt", p->timeTotal );
    if ( nRuntimeLimit && Abc_Clock() > nRuntimeLimit )
        printf( "Gate sizing timed out at %d seconds.\n", pPars->TimeOut );

    // save the result and quit
    Abc_SclSclGates2MioGates( pLib, pNtk ); // updates gate pointers
    Abc_SclManFree( p );
//    Abc_NtkCleanMarkAB( pNtk );
}